

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O2

void __thiscall
re2c::DFA::count_used_labels
          (DFA *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used,
          label_t start,label_t initial,bool force_start)

{
  State *pSVar1;
  pointer ppSVar2;
  uint uVar3;
  opt_t *poVar4;
  size_type sVar5;
  State **ppSVar6;
  label_t local_34;
  label_t local_30;
  label_t local_2c;
  
  local_34.value = initial.value;
  local_30.value = start.value;
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar4->fFlag == true) {
    local_2c = label_t::first();
    std::
    _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
    ::_M_insert_unique<re2c::label_t>(&used->_M_t,&local_2c);
  }
  if (force_start) {
    std::
    _Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
    ::_M_insert_unique<re2c::label_t_const&>
              ((_Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
                *)used,&local_30);
  }
  ppSVar6 = &this->head;
  while (pSVar1 = *ppSVar6, pSVar1 != (State *)0x0) {
    Go::used_labels(&pSVar1->go,used);
    ppSVar6 = &pSVar1->next;
  }
  uVar3 = 0;
  while( true ) {
    ppSVar2 = (this->accepts).elems.
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->accepts).elems.
                      super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <=
        (ulong)uVar3) break;
    std::
    _Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
    ::_M_insert_unique<re2c::label_t_const&>
              ((_Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
                *)used,&ppSVar2[uVar3]->label);
    uVar3 = uVar3 + 1;
  }
  sVar5 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::count
                    (used,&this->head->label);
  if (sVar5 != 0) {
    std::
    _Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
    ::_M_insert_unique<re2c::label_t_const&>
              ((_Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
                *)used,&local_34);
  }
  return;
}

Assistant:

void DFA::count_used_labels (std::set<label_t> & used, label_t start, label_t initial, bool force_start) const
{
	// In '-f' mode, default state is always state 0
	if (opts->fFlag)
	{
		used.insert (label_t::first ());
	}
	if (force_start)
	{
		used.insert (start);
	}
	for (State * s = head; s; s = s->next)
	{
		s->go.used_labels (used);
	}
	for (uint32_t i = 0; i < accepts.size (); ++i)
	{
		used.insert (accepts[i]->label);
	}
	// must go last: it needs the set of used labels
	if (used.count (head->label))
	{
		used.insert (initial);
	}
}